

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O0

string * formal_usage(string *section)

{
  __type_conflict _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  reference pvVar3;
  size_t in_RSI;
  string *in_RDI;
  size_t i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  size_type i;
  string *ret;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  long local_30;
  byte local_11;
  string *str;
  
  local_11 = 0;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffffee;
  this = in_RDI;
  str = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"(",(allocator *)__rhs);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffee);
  local_30 = std::__cxx11::string::find((char)in_RSI,0x3a);
  local_30 = local_30 + 1;
  anon_unknown.dwarf_15e08f::split(str,in_RSI);
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  while( true ) {
    __lhs = pbVar4;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(&local_48);
    if (pbVar2 <= pbVar4) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_48,(size_type)__lhs);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_48,0);
    _Var1 = std::operator==(__lhs,__rhs);
    if (_Var1) {
      std::__cxx11::string::operator+=((string *)this," ) | (");
    }
    else {
      std::__cxx11::string::push_back((char)this);
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_48,(size_type)__lhs);
      std::__cxx11::string::operator+=((string *)this,(string *)pvVar3);
    }
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__lhs->field_0x1;
  }
  std::__cxx11::string::operator+=((string *)this," )");
  local_11 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this);
  if ((local_11 & 1) == 0) {
    std::__cxx11::string::~string((string *)this);
  }
  return in_RDI;
}

Assistant:

std::string formal_usage(std::string const& section) {
	std::string ret = "(";
	
	auto i = section.find(':')+1;  // skip past "usage:"
	auto parts = split(section, i);
	for(size_t i = 1; i < parts.size(); ++i) {
		if (parts[i] == parts[0]) {
			ret += " ) | (";
		} else {
			ret.push_back(' ');
			ret += parts[i];
		}
	}
	
	ret += " )";
	return ret;
}